

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::~IfcTendon(IfcTendon *this,void **vtt)

{
  void **vtt_local;
  IfcTendon *this_local;
  
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject = *vtt;
  *(void **)((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 +
            *(long *)(*(long *)&(this->super_IfcReinforcingElement).
                                super_IfcBuildingElementComponent.super_IfcBuildingElement.
                                super_IfcElement.super_IfcProduct.super_IfcObject + -0x18)) =
       vtt[0x3f];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x40];
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x42];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 = vtt[0x43];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x138 = vtt[0x44];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x148 = vtt[0x45];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.field_0x158 = vtt[0x46];
  *(void **)&(this->super_IfcReinforcingElement).field_0x190 = vtt[0x47];
  std::__cxx11::string::~string((string *)&(this->super_IfcReinforcingElement).field_0x1a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,vtt + 0x3d);
  Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement
            (&this->super_IfcReinforcingElement,vtt + 1);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}